

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::Module> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::Module>,LLVMBC::Module*&>
          (LLVMContext *this,Module **u)

{
  TypedDeleter<LLVMBC::Module> *this_00;
  TypedDeleter<LLVMBC::Module> *t;
  TypedDeleter<LLVMBC::Module> *mem;
  Module **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::Module> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::Module> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::Module>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}